

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer.cpp
# Opt level: O1

void __thiscall udpdiscovery::impl::PeerEnv::PeerEnv(PeerEnv *this)

{
  (this->super_PeerEnvInterface)._vptr_PeerEnvInterface = (_func_int **)&PTR__PeerEnv_0010ad10;
  (this->parameters_).min_supported_protocol_version_ = kProtocolVersion1;
  (this->parameters_).max_supported_protocol_version_ = kProtocolVersion1;
  (this->parameters_).application_id_ = 0;
  (this->parameters_).can_use_broadcast_ = true;
  (this->parameters_).can_use_multicast_ = false;
  (this->parameters_).port_ = 0;
  (this->parameters_).multicast_group_address_ = 0;
  (this->parameters_).send_timeout_ms_ = 5000;
  (this->parameters_).discovered_peer_ttl_ms_ = 10000;
  (this->parameters_).can_be_discovered_ = false;
  (this->parameters_).can_discover_ = false;
  (this->parameters_).discover_self_ = false;
  (this->parameters_).same_peer_mode_ = kSamePeerIpAndPort;
  this->binding_sock_ = -1;
  this->sock_ = -1;
  this->packet_index_ = 0;
  pthread_mutex_init((pthread_mutex_t *)&this->lock_,(pthread_mutexattr_t *)0x0);
  this->ref_count_ = 0;
  this->exit_ = false;
  (this->user_data_)._M_dataplus._M_p = (pointer)&(this->user_data_).field_2;
  (this->user_data_)._M_string_length = 0;
  (this->user_data_).field_2._M_local_buf[0] = '\0';
  (this->discovered_peers_).
  super__List_base<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>.
  _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->discovered_peers_;
  (this->discovered_peers_).
  super__List_base<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>.
  _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->discovered_peers_;
  (this->discovered_peers_).
  super__List_base<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>.
  _M_impl._M_node._M_size = 0;
  return;
}

Assistant:

PeerEnv()
      : binding_sock_(kInvalidSocket),
        sock_(kInvalidSocket),
        packet_index_(0),
        ref_count_(0),
        exit_(false) {}